

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_distFcnElement.cpp
# Opt level: O0

void __thiscall
amrex::SplineDistFcnElement2d::dxbydt
          (SplineDistFcnElement2d *this,Real t,Real y0,Real y1,Real D0,Real D1,Real *dyf,Real *d2yf)

{
  double dVar1;
  double dVar2;
  Real d;
  Real c;
  Real *d2yf_local;
  Real *dyf_local;
  Real D1_local;
  Real D0_local;
  Real y1_local;
  Real y0_local;
  Real t_local;
  SplineDistFcnElement2d *this_local;
  
  dVar1 = ((y1 - y0) * 3.0 + -(D0 * 2.0)) - D1;
  dVar2 = (y0 - y1) + (y0 - y1) + D0 + D1;
  *dyf = dVar2 * 3.0 * t * t + dVar1 * 2.0 * t + D0;
  *d2yf = dVar1 + dVar1 + dVar2 * 6.0 * t;
  return;
}

Assistant:

void SplineDistFcnElement2d::dxbydt(amrex::Real t,
                                    amrex::Real y0, amrex::Real y1,
                                    amrex::Real D0, amrex::Real D1,
                                    amrex::Real& dyf, amrex::Real& d2yf)
                                    const {
  amrex::Real c, d;
  c = 3.0*(y1 - y0) - 2.0*D0 - D1;
  d = 2.0*(y0-y1) + D0 + D1;

  dyf = D0 + 2.0*c*t + 3.0*d*t*t;
  d2yf = 2.0*c + 6.0*d*t;
  return;
}